

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O3

void __thiscall
github111116::ConsoleLogger::print<char*,char[23]>(ConsoleLogger *this,char **t,char (*args) [23])

{
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  
  poVar1 = this->out;
  __s = *t;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  print<char[23]>(this,args);
  return;
}

Assistant:

void ConsoleLogger::print(const T& t, const Args&... args)
{
	out << t << " ";
	print(args...);
}